

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParserNsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlParserNsData *pxVar1;
  xmlParserNsExtra *pxVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  xmlChar **ppxVar6;
  xmlParserNsBucket *bucket;
  xmlHashedString hprefix;
  xmlParserNsBucket *local_48;
  xmlHashedString local_40;
  
  lVar5 = (long)ctxt->nsNr;
  lVar3 = lVar5 - nr;
  if (0 < nr) {
    pxVar1 = ctxt->nsdb;
    ppxVar6 = ctxt->nsTab + lVar5 * 2;
    lVar4 = lVar5 * 0x18 + -4;
    do {
      ppxVar6 = ppxVar6 + -2;
      local_40.name = *ppxVar6;
      pxVar2 = pxVar1->extra;
      if (local_40.name == (xmlChar *)0x0) {
        pxVar1->defaultNsIndex = *(int *)((long)&pxVar2->saxData + lVar4);
      }
      else {
        local_48 = (xmlParserNsBucket *)0x0;
        local_40.hashValue = *(uint *)((long)pxVar2 + lVar4 + -0xc);
        xmlParserNsLookup(ctxt,&local_40,&local_48);
        local_48->index = *(int *)((long)&pxVar2->saxData + lVar4);
      }
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + -0x18;
    } while (lVar3 < lVar5);
  }
  ctxt->nsNr = (int)lVar3;
  return nr;
}

Assistant:

static int
xmlParserNsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    /* assert(nr <= ctxt->nsNr); */

    for (i = ctxt->nsNr - 1; i >= ctxt->nsNr - nr; i--) {
        const xmlChar *prefix = ctxt->nsTab[i * 2];
        xmlParserNsExtra *extra = &ctxt->nsdb->extra[i];

        if (prefix == NULL) {
            ctxt->nsdb->defaultNsIndex = extra->oldIndex;
        } else {
            xmlHashedString hprefix;
            xmlParserNsBucket *bucket = NULL;

            hprefix.name = prefix;
            hprefix.hashValue = extra->prefixHashValue;
            xmlParserNsLookup(ctxt, &hprefix, &bucket);
            /* assert(bucket && bucket->hashValue); */
            bucket->index = extra->oldIndex;
        }
    }

    ctxt->nsNr -= nr;
    return(nr);
}